

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_new.c
# Opt level: O1

mpt_metatype * mpt_meta_new(mpt_value *val)

{
  int iVar1;
  char *src_00;
  mpt_type_traits *traits;
  mpt_buffer *buf;
  long lVar2;
  mpt_metatype *pmVar3;
  int *piVar4;
  size_t len_00;
  size_t len;
  mpt_array a;
  void *src;
  int local_38;
  undefined4 uStack_34;
  mpt_array local_30;
  void *local_28;
  
  local_28 = val->_addr;
  src_00 = mpt_data_tostring(&local_28,val->_type,(size_t *)&local_38);
  if (src_00 != (char *)0x0) {
    if (CONCAT44(uStack_34,local_38) < 0xff) {
      pmVar3 = mpt_meta_geninfo(CONCAT44(uStack_34,local_38));
      if (pmVar3 == (mpt_metatype *)0x0) {
        return (mpt_metatype *)0x0;
      }
      if (local_28 == (void *)0x0) {
        return pmVar3;
      }
      iVar1 = _mpt_geninfo_set(pmVar3 + 1,src_00,local_38);
      if (-1 < iVar1) {
        return pmVar3;
      }
      (*pmVar3->_vptr->unref)(pmVar3);
    }
    else {
      local_30._buf = (mpt_buffer *)0x0;
      traits = mpt_type_traits(99);
      if (traits != (mpt_type_traits *)0x0) {
        len_00 = CONCAT44(uStack_34,local_38);
        if (len_00 != 0) {
          len_00 = (len_00 + 1) - (ulong)(src_00[len_00 - 1] == '\0');
        }
        buf = mpt_array_reserve(&local_30,len_00,traits);
        if (buf == (mpt_buffer *)0x0) {
          return (mpt_metatype *)0x0;
        }
        lVar2 = mpt_buffer_set(buf,traits,CONCAT44(uStack_34,local_38),src_00,0);
        if ((lVar2 == 0) ||
           ((CONCAT44(uStack_34,local_38) < len_00 &&
            (lVar2 = mpt_buffer_set(buf,traits,1,"",CONCAT44(uStack_34,local_38)), lVar2 == 0)))) {
          pmVar3 = (mpt_metatype *)0x0;
        }
        else {
          pmVar3 = mpt_meta_buffer(&local_30);
        }
        mpt_array_clone(&local_30,(mpt_array *)0x0);
        return pmVar3;
      }
    }
  }
  piVar4 = __errno_location();
  *piVar4 = 0x16;
  return (mpt_metatype *)0x0;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_meta_new(const MPT_STRUCT(value) *val)
{
	MPT_INTERFACE(metatype) *mt;
	const void *src;
	const char *text;
	size_t len;
	
	src = val->_addr;
	if (!(text = mpt_data_tostring(&src, val->_type, &len))) {
		/* TODO generic type representation */
		errno = EINVAL;
		return 0;
	}
	/* data too big for basic type */
	if (len >= UINT8_MAX) {
		MPT_STRUCT(array) a = MPT_ARRAY_INIT;
		MPT_STRUCT(buffer) *buf;
		const MPT_STRUCT(type_traits) *traits;
		size_t reserve;
		
		if (!(traits = mpt_type_traits('c'))) {
			errno = EINVAL;
			return 0;
		}
		/* create new text data array */
		reserve = (len && text[len - 1]) ? len + 1 : len;
		if (!(buf = mpt_array_reserve(&a, reserve, traits))) {
			return 0;
		}
		if (!mpt_buffer_set(buf, traits, len, text, 0)
		 || ((reserve > len) && !mpt_buffer_set(buf, traits, 1, "", len))) {
			mpt_array_clone(&a, 0);
			return 0;
		}
		/* metatype with buffer text store */
		mt = mpt_meta_buffer(&a);
		mpt_array_clone(&a, 0);
		return mt;
	}
	if (!(mt = mpt_meta_geninfo(len))
	    || !src
	    || _mpt_geninfo_set(mt + 1, text, len) >= 0) {
		return mt;
	}
	mt->_vptr->unref(mt);
	errno = EINVAL;
	return 0;
}